

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

void __thiscall despot::Adventurer::PrintPOMDPX(Adventurer *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  int goal;
  long lVar5;
  long lVar6;
  int s;
  int iVar7;
  int a;
  int s_1;
  int i;
  ulong uVar8;
  long lVar9;
  double dVar10;
  allocator<char> local_91;
  Adventurer *local_90;
  double local_88;
  long local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  actions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  actions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  actions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"stay",&local_91);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&actions,&local_58
            );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"left",&local_91);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&actions,&local_58
            );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"right",&local_91);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&actions,&local_58
            );
  std::__cxx11::string::~string((string *)&local_58);
  poVar4 = std::operator<<((ostream *)&std::cout,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,
                           "<pomdpx version=\'1.0\' id=\'tagxmlfac\' xmlns:xsi=\'http://www.w3.org/2001/XMLSchema-instance\' xsi:noNamespaceSchemaLocation=\'pomdpx.xsd\'>"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<Description>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"description");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"</Description>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<Discount>0.95</Discount>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"<Variable>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,
                           "<StateVar vnamePrev=\"state_0\" vnameCurr=\"state_1\" fullyObs=\"false\"> <ValueEnum>"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar7 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)local_90 + 0xf8))();
    if (iVar3 <= iVar7) break;
    poVar4 = std::operator<<((ostream *)&std::cout," s");
    std::ostream::operator<<((ostream *)poVar4,iVar7);
    iVar7 = iVar7 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout," st </ValueEnum> </StateVar>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<ObsVar vname=\"obs\"> <ValueEnum>");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (iVar7 = 0; iVar7 < local_90->num_goals_; iVar7 = iVar7 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout," o");
    std::ostream::operator<<((ostream *)poVar4,iVar7);
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ot");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"</ValueEnum>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"</ObsVar>");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,
                           "<ActionVar vname=\"action\"> <ValueEnum> stay left right </ValueEnum> </ActionVar>"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<RewardVar vname=\"reward\"/> </Variable>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<InitialStateBelief> <CondProb> <Var> state_0 </Var> <Parent> null </Parent>"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<Parameter type = \"TBL\">");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (iVar7 = 0; iVar7 < local_90->num_goals_; iVar7 = iVar7 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> s");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_90->size_ * iVar7);
    std::operator<<(poVar4," </Instance> <ProbTable> ");
    poVar4 = std::ostream::_M_insert<double>(1.0 / (double)local_90->num_goals_);
    poVar4 = std::operator<<(poVar4," </ProbTable> </Entry>");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"</Parameter> </CondProb> </InitialStateBelief>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<StateTransitionFunction> <CondProb> <Var> state_1 </Var> <Parent>action state_0</Parent>"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<Parameter type = \"TBL\">");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar6 = 0;
  while( true ) {
    iVar7 = (**(code **)(*(long *)local_90 + 0xf8))();
    if (iVar7 <= lVar6) break;
    lVar9 = 0;
    local_80 = lVar6;
    while( true ) {
      iVar7 = (**(code **)(*(long *)local_90 + 0x28))();
      if (iVar7 <= lVar9) break;
      local_88 = 0.0;
      lVar5 = 0x18;
      local_38 = lVar9;
      for (uVar8 = 0;
          lVar1 = *(long *)&(local_90->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data,
          lVar2 = *(long *)(lVar1 + lVar9 * 0x18),
          uVar8 < (ulong)(*(long *)(lVar1 + 8 + lVar9 * 0x18) - lVar2 >> 5); uVar8 = uVar8 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (actions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar9));
        poVar4 = std::operator<<(poVar4," s");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)local_80);
        poVar4 = std::operator<<(poVar4," s");
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar2 + -0xc + lVar5));
        std::operator<<(poVar4," </Instance> <ProbTable> ");
        poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar2 + lVar5));
        poVar4 = std::operator<<(poVar4," </ProbTable> </Entry>");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_88 = local_88 + *(double *)(lVar2 + lVar5);
        lVar5 = lVar5 + 0x20;
      }
      if (1e-06 < ABS(local_88 + -1.0)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (actions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar9));
        poVar4 = std::operator<<(poVar4," s");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)local_80);
        std::operator<<(poVar4," st </Instance> <ProbTable> ");
        poVar4 = std::ostream::_M_insert<double>(1.0 - local_88);
        poVar4 = std::operator<<(poVar4," </ProbTable> </Entry>");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      lVar9 = local_38 + 1;
    }
    lVar6 = local_80 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<Entry> <Instance> * st st </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "</Parameter> </CondProb> </StateTransitionFunction>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<ObsFunction> <CondProb> <Var> obs </Var> <Parent>action state_1</Parent>"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<Parameter type = \"TBL\">");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar8 = 0;
  while( true ) {
    iVar7 = (**(code **)(*(long *)local_90 + 0x28))();
    if ((long)iVar7 <= (long)uVar8) break;
    lVar6 = 0;
    while( true ) {
      iVar7 = (**(code **)(*(long *)local_90 + 0xf8))();
      if (iVar7 <= lVar6) break;
      for (lVar9 = 0; lVar9 < local_90->num_goals_; lVar9 = lVar9 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        (actions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar8));
        poVar4 = std::operator<<(poVar4," s");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar6);
        poVar4 = std::operator<<(poVar4," o");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar9);
        std::operator<<(poVar4," </Instance> <ProbTable> ");
        dVar10 = (double)(**(code **)(*(long *)local_90 + 0x38))
                                   (local_90,lVar9,
                                    (local_90->states_).
                                    super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar6],
                                    uVar8 & 0xffffffff);
        poVar4 = std::ostream::_M_insert<double>(dVar10);
        poVar4 = std::operator<<(poVar4," </ProbTable> </Entry>");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      lVar6 = lVar6 + 1;
    }
    uVar8 = uVar8 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<Entry> <Instance> * st ot </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"</Parameter> </CondProb> </ObsFunction>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<RewardFunction> <Func> <Var> reward </Var> <Parent>action state_0</Parent>"
                          );
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"<Parameter type = \"TBL\">");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar8 = 0;
  while( true ) {
    iVar7 = (**(code **)(*(long *)local_90 + 0x28))();
    if ((long)iVar7 <= (long)uVar8) break;
    iVar7 = 0;
    while( true ) {
      iVar3 = (**(code **)(*(long *)local_90 + 0xf8))();
      if (iVar3 <= iVar7) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"<Entry> <Instance> ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      (actions.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar8));
      poVar4 = std::operator<<(poVar4," s");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar7);
      std::operator<<(poVar4," </Instance> <ValueTable> ");
      dVar10 = (double)(**(code **)(*(long *)local_90 + 0x118))(local_90,iVar7,uVar8 & 0xffffffff);
      poVar4 = std::ostream::_M_insert<double>(dVar10);
      poVar4 = std::operator<<(poVar4," </ValueTable> </Entry>");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar7 = iVar7 + 1;
    }
    uVar8 = uVar8 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "<Entry> <Instance> * st </Instance> <ValueTable> 0 </ValueTable> </Entry>"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"</Parameter> </Func> </RewardFunction>");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"</pomdpx>");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&actions);
  return;
}

Assistant:

void Adventurer::PrintPOMDPX() const {
	vector<string> actions;
	actions.push_back("stay");
	actions.push_back("left");
	actions.push_back("right");

	cout << "<?xml version='1.0' encoding='ISO-8859-1'?>" << endl
		<< "<pomdpx version='1.0' id='tagxmlfac' xmlns:xsi='http://www.w3.org/2001/XMLSchema-instance' xsi:noNamespaceSchemaLocation='pomdpx.xsd'>"
		<< endl << "<Description>" << endl << "description" << endl
		<< "</Description>" << endl << "<Discount>0.95</Discount>" << endl;

	cout << "<Variable>" << endl
		<< "<StateVar vnamePrev=\"state_0\" vnameCurr=\"state_1\" fullyObs=\"false\"> <ValueEnum>"
		<< endl;
	for (int s = 0; s < NumStates(); s++)
		cout << " s" << s;
	cout << " st </ValueEnum> </StateVar>" << endl << endl
		<< "<ObsVar vname=\"obs\"> <ValueEnum>" << endl;
	for (int g = 0; g < num_goals_; g++)
		cout << " o" << g;
	cout << " ot" << endl << "</ValueEnum>" << endl << "</ObsVar>" << endl
		<< "<ActionVar vname=\"action\"> <ValueEnum> stay left right </ValueEnum> </ActionVar>"
		<< endl << "<RewardVar vname=\"reward\"/> </Variable>" << endl;

	cout
		<< "<InitialStateBelief> <CondProb> <Var> state_0 </Var> <Parent> null </Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int goal = 0; goal < num_goals_; goal++) {
		cout << "<Entry> <Instance> s" << goal * size_
			<< " </Instance> <ProbTable> " << 1.0 / num_goals_
			<< " </ProbTable> </Entry>" << endl;
	}
	cout << "</Parameter> </CondProb> </InitialStateBelief>" << endl;

	cout
		<< "<StateTransitionFunction> <CondProb> <Var> state_1 </Var> <Parent>action state_0</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int s = 0; s < NumStates(); s++) {
		for (int a = 0; a < NumActions(); a++) {
			double sum = 0;
			for (int i = 0; i < transition_probabilities_[s][a].size(); i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << "<Entry> <Instance> " << actions[a] << " s" << s << " s"
					<< next.state_id << " </Instance> <ProbTable> "
					<< next.weight << " </ProbTable> </Entry>" << endl;
				sum += next.weight;
			}

			if (fabs(sum - 1.0) > 0.000001)
				cout << "<Entry> <Instance> " << actions[a] << " s" << s
					<< " st </Instance> <ProbTable> " << (1 - sum)
					<< " </ProbTable> </Entry>" << endl;
		}
	}
	cout
		<< "<Entry> <Instance> * st st </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
		<< endl;
	cout << "</Parameter> </CondProb> </StateTransitionFunction>" << endl;

	cout
		<< "<ObsFunction> <CondProb> <Var> obs </Var> <Parent>action state_1</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int a = 0; a < NumActions(); a++) {
		for (int s = 0; s < NumStates(); s++) {
			for (int o = 0; o < num_goals_; o++) {
				cout << "<Entry> <Instance> " << actions[a] << " s" << s << " o"
					<< o << " </Instance> <ProbTable> "
					<< ObsProb(o, *(states_[s]), a) << " </ProbTable> </Entry>"
					<< endl;
			}
		}
	}
	cout
		<< "<Entry> <Instance> * st ot </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
		<< endl;
	cout << "</Parameter> </CondProb> </ObsFunction>" << endl;

	cout
		<< "<RewardFunction> <Func> <Var> reward </Var> <Parent>action state_0</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int a = 0; a < NumActions(); a++) {
		for (int s = 0; s < NumStates(); s++) {
			cout << "<Entry> <Instance> " << actions[a] << " s" << s
				<< " </Instance> <ValueTable> " << Reward(s, a)
				<< " </ValueTable> </Entry>" << endl;
		}
	}
	cout
		<< "<Entry> <Instance> * st </Instance> <ValueTable> 0 </ValueTable> </Entry>"
		<< endl;
	cout << "</Parameter> </Func> </RewardFunction>" << endl;
	cout << "</pomdpx>" << endl;
}